

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O0

gpointer g_hash_table_lookup(GHashTable *hash_table,gconstpointer key)

{
  guint gVar1;
  GHashTable *local_38;
  guint node_index;
  GHashNode *node;
  gconstpointer key_local;
  GHashTable *hash_table_local;
  
  if (hash_table == (GHashTable *)0x0) {
    hash_table_local = (GHashTable *)0x0;
  }
  else {
    gVar1 = g_hash_table_lookup_node(hash_table,key);
    if (hash_table->nodes[gVar1].key_hash == 0) {
      local_38 = (GHashTable *)0x0;
    }
    else {
      local_38 = (GHashTable *)hash_table->nodes[gVar1].value;
    }
    hash_table_local = local_38;
  }
  return hash_table_local;
}

Assistant:

gpointer g_hash_table_lookup (GHashTable   *hash_table,
        gconstpointer key)
{
    GHashNode *node;
    guint      node_index;

    if (hash_table == NULL) return NULL;

    node_index = g_hash_table_lookup_node (hash_table, key);
    node = &hash_table->nodes [node_index];

    return node->key_hash ? node->value : NULL;
}